

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O1

int quote_fname_ufs(char *file)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  byte *pbVar8;
  char fbuf [256];
  byte local_108 [264];
  
  pbVar4 = local_108;
  pbVar5 = local_108;
  pbVar6 = (byte *)file;
  do {
    bVar1 = *pbVar6;
    lVar7 = 1;
    pbVar8 = pbVar4;
    if (bVar1 < 0x3b) {
      if (bVar1 == 0x27) goto LAB_0013740b;
      if (bVar1 == 0) {
        *pbVar4 = 0;
        if (local_108[0] == 0) {
          bVar3 = true;
        }
        else {
          bVar2 = false;
          pbVar6 = local_108;
          do {
            pbVar5 = pbVar6 + 1;
            if (local_108[0] == 0x27) {
              if (pbVar6[1] != 0) {
                pbVar5 = pbVar6 + 2;
              }
            }
            else if ((local_108[0] == 0x2e) && (*pbVar5 != 0)) {
              bVar2 = true;
            }
            local_108[0] = *pbVar5;
            bVar3 = !bVar2;
          } while ((local_108[0] != 0) && (pbVar6 = pbVar5, !bVar2));
        }
        if (bVar3) {
          if (pbVar5[-1] == 0x2e) {
            pbVar5[-1] = 0x27;
            pbVar5[0] = 0x2e;
            pbVar5 = pbVar5 + 1;
          }
          pbVar5[0] = 0x2e;
          pbVar5[1] = 0;
        }
        strcpy(file,(char *)local_108);
        return 1;
      }
    }
    else if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) {
LAB_0013740b:
      *pbVar4 = 0x27;
      lVar7 = 2;
      pbVar8 = pbVar4 + 1;
    }
    pbVar4 = pbVar4 + lVar7;
    *pbVar8 = bVar1;
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

int quote_fname_ufs(char *file)
{
  char *cp, *dp;
  int extensionp;
  char fbuf[MAXNAMLEN + 1];

  cp = file;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file
   * name or not.  If extension field is not included, we have to add a
   * period to specify empty extension field.
   */
  cp = fbuf;
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.':
        if (*(cp + 1)) extensionp = 1;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    if (*(cp - 1) == '.') {
      *(cp - 1) = '\'';
      *cp++ = '.';
    }
    *cp++ = '.';
    *cp = '\0';
  }
  strcpy(file, fbuf);
  return (1);
}